

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

UBool haveAliasData(UErrorCode *pErrorCode)

{
  icu_63::umtx_initOnce(&gAliasDataInitOnce,initAliasData,pErrorCode);
  return *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

static UBool
haveAliasData(UErrorCode *pErrorCode) {
    umtx_initOnce(gAliasDataInitOnce, &initAliasData, *pErrorCode);
    return U_SUCCESS(*pErrorCode);
}